

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void Parser::print(TreeNode *treeNode,int deep)

{
  int *piVar1;
  ostream *poVar2;
  int iVar3;
  int *piVar4;
  
  if (1 < deep) {
    iVar3 = deep + -1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(treeNode->name)._M_dataplus._M_p,
             (treeNode->name)._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)&treeNode->attr);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&treeNode->attr);
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," :",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(treeNode->attr)._M_dataplus._M_p,
                 (treeNode->attr)._M_string_length);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,treeNode->lineNum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,treeNode->opt);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  piVar4 = (treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar4 != piVar1) {
    do {
      print(resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
            super__Vector_impl_data._M_start + *piVar4,deep + 1);
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar1);
  }
  return;
}

Assistant:

void print(const TreeNode &treeNode,int deep){
        for(int i = 1;i < deep;i++){
            cout<<"  ";
        }
        cout<<treeNode.name;
        if(treeNode.attr!="_"&&treeNode.attr!=" "){
            cout<<" :"<<treeNode.attr;
        }
        cout<<"("<<treeNode.lineNum<<","<<treeNode.opt<<")"<<endl;
        for(int t:treeNode.sons){
            print(resultTree[t],deep+1);
        }
    }